

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall efsw::String::String(String *this,wchar_t wideChar)

{
  char32_t __c;
  wchar_t wideChar_local;
  String *this_local;
  
  std::__cxx11::u32string::u32string((u32string *)this);
  __c = Utf<32U>::DecodeWide<wchar_t>(wideChar);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  operator+=(&this->mString,__c);
  return;
}

Assistant:

String::String( wchar_t wideChar ) {
	mString += Utf32::DecodeWide( wideChar );
}